

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::CurrencySpacingEnabledModifier::CurrencySpacingEnabledModifier
          (CurrencySpacingEnabledModifier *this,NumberStringBuilder *prefix,
          NumberStringBuilder *suffix,bool overwrite,bool strong,DecimalFormatSymbols *symbols,
          UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  Field FVar3;
  UnicodeString local_228;
  UnicodeSet local_1e8;
  undefined1 local_190 [8];
  UnicodeSet suffixUnicodeSet;
  undefined1 local_130 [4];
  int suffixCp;
  UnicodeSet local_f0;
  undefined1 local_98 [8];
  UnicodeSet prefixUnicodeSet;
  int prefixCp;
  DecimalFormatSymbols *symbols_local;
  bool strong_local;
  bool overwrite_local;
  NumberStringBuilder *suffix_local;
  NumberStringBuilder *prefix_local;
  CurrencySpacingEnabledModifier *this_local;
  
  ConstantMultiFieldModifier::ConstantMultiFieldModifier
            (&this->super_ConstantMultiFieldModifier,prefix,suffix,overwrite,strong);
  (this->super_ConstantMultiFieldModifier).super_Modifier._vptr_Modifier =
       (_func_int **)&PTR__CurrencySpacingEnabledModifier_005bafc0;
  UnicodeSet::UnicodeSet(&this->fAfterPrefixUnicodeSet);
  icu_63::UnicodeString::UnicodeString(&this->fAfterPrefixInsert);
  UnicodeSet::UnicodeSet(&this->fBeforeSuffixUnicodeSet);
  icu_63::UnicodeString::UnicodeString(&this->fBeforeSuffixInsert);
  iVar2 = NumberStringBuilder::length(prefix);
  if (0 < iVar2) {
    iVar2 = NumberStringBuilder::length(prefix);
    FVar3 = NumberStringBuilder::fieldAt(prefix,iVar2 + -1);
    if (FVar3 == UNUM_CURRENCY_FIELD) {
      prefixUnicodeSet._80_4_ = NumberStringBuilder::getLastCodePoint(prefix);
      getUnicodeSet((UnicodeSet *)local_98,symbols,IN_CURRENCY,PREFIX,status);
      UVar1 = UnicodeSet::contains((UnicodeSet *)local_98,prefixUnicodeSet._80_4_);
      if (UVar1 == '\0') {
        UnicodeSet::setToBogus(&this->fAfterPrefixUnicodeSet);
        icu_63::UnicodeString::setToBogus(&this->fAfterPrefixInsert);
      }
      else {
        getUnicodeSet(&local_f0,symbols,IN_NUMBER,PREFIX,status);
        UnicodeSet::operator=(&this->fAfterPrefixUnicodeSet,&local_f0);
        UnicodeSet::~UnicodeSet(&local_f0);
        UnicodeSet::freeze(&this->fAfterPrefixUnicodeSet);
        getInsertString((UnicodeString *)local_130,symbols,PREFIX,status);
        icu_63::UnicodeString::operator=(&this->fAfterPrefixInsert,(UnicodeString *)local_130);
        icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_130);
      }
      UnicodeSet::~UnicodeSet((UnicodeSet *)local_98);
      goto LAB_003378fc;
    }
  }
  UnicodeSet::setToBogus(&this->fAfterPrefixUnicodeSet);
  icu_63::UnicodeString::setToBogus(&this->fAfterPrefixInsert);
LAB_003378fc:
  iVar2 = NumberStringBuilder::length(suffix);
  if ((0 < iVar2) && (FVar3 = NumberStringBuilder::fieldAt(suffix,0), FVar3 == UNUM_CURRENCY_FIELD))
  {
    suffixUnicodeSet._84_4_ = NumberStringBuilder::getLastCodePoint(suffix);
    getUnicodeSet((UnicodeSet *)local_190,symbols,IN_CURRENCY,SUFFIX,status);
    UVar1 = UnicodeSet::contains((UnicodeSet *)local_190,suffixUnicodeSet._84_4_);
    if (UVar1 == '\0') {
      UnicodeSet::setToBogus(&this->fBeforeSuffixUnicodeSet);
      icu_63::UnicodeString::setToBogus(&this->fBeforeSuffixInsert);
    }
    else {
      getUnicodeSet(&local_1e8,symbols,IN_NUMBER,SUFFIX,status);
      UnicodeSet::operator=(&this->fBeforeSuffixUnicodeSet,&local_1e8);
      UnicodeSet::~UnicodeSet(&local_1e8);
      UnicodeSet::freeze(&this->fBeforeSuffixUnicodeSet);
      getInsertString(&local_228,symbols,SUFFIX,status);
      icu_63::UnicodeString::operator=(&this->fBeforeSuffixInsert,&local_228);
      icu_63::UnicodeString::~UnicodeString(&local_228);
    }
    UnicodeSet::~UnicodeSet((UnicodeSet *)local_190);
    return;
  }
  UnicodeSet::setToBogus(&this->fBeforeSuffixUnicodeSet);
  icu_63::UnicodeString::setToBogus(&this->fBeforeSuffixInsert);
  return;
}

Assistant:

CurrencySpacingEnabledModifier::CurrencySpacingEnabledModifier(const NumberStringBuilder &prefix,
                                                               const NumberStringBuilder &suffix,
                                                               bool overwrite,
                                                               bool strong,
                                                               const DecimalFormatSymbols &symbols,
                                                               UErrorCode &status)
        : ConstantMultiFieldModifier(prefix, suffix, overwrite, strong) {
    // Check for currency spacing. Do not build the UnicodeSets unless there is
    // a currency code point at a boundary.
    if (prefix.length() > 0 && prefix.fieldAt(prefix.length() - 1) == UNUM_CURRENCY_FIELD) {
        int prefixCp = prefix.getLastCodePoint();
        UnicodeSet prefixUnicodeSet = getUnicodeSet(symbols, IN_CURRENCY, PREFIX, status);
        if (prefixUnicodeSet.contains(prefixCp)) {
            fAfterPrefixUnicodeSet = getUnicodeSet(symbols, IN_NUMBER, PREFIX, status);
            fAfterPrefixUnicodeSet.freeze();
            fAfterPrefixInsert = getInsertString(symbols, PREFIX, status);
        } else {
            fAfterPrefixUnicodeSet.setToBogus();
            fAfterPrefixInsert.setToBogus();
        }
    } else {
        fAfterPrefixUnicodeSet.setToBogus();
        fAfterPrefixInsert.setToBogus();
    }
    if (suffix.length() > 0 && suffix.fieldAt(0) == UNUM_CURRENCY_FIELD) {
        int suffixCp = suffix.getLastCodePoint();
        UnicodeSet suffixUnicodeSet = getUnicodeSet(symbols, IN_CURRENCY, SUFFIX, status);
        if (suffixUnicodeSet.contains(suffixCp)) {
            fBeforeSuffixUnicodeSet = getUnicodeSet(symbols, IN_NUMBER, SUFFIX, status);
            fBeforeSuffixUnicodeSet.freeze();
            fBeforeSuffixInsert = getInsertString(symbols, SUFFIX, status);
        } else {
            fBeforeSuffixUnicodeSet.setToBogus();
            fBeforeSuffixInsert.setToBogus();
        }
    } else {
        fBeforeSuffixUnicodeSet.setToBogus();
        fBeforeSuffixInsert.setToBogus();
    }
}